

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

double ERREV(int NN,double *QR,double *QI,double MS,double MP,double ARE,double MRE)

{
  double dVar1;
  int local_54;
  double dStack_50;
  int i;
  double E;
  double errev;
  double MRE_local;
  double ARE_local;
  double MP_local;
  double MS_local;
  double *QI_local;
  double *QR_local;
  int NN_local;
  
  dVar1 = CMOD(QR,QI);
  dStack_50 = (dVar1 * MRE) / (ARE + MRE);
  for (local_54 = 0; local_54 < NN; local_54 = local_54 + 1) {
    dVar1 = CMOD(QR + local_54,QI + local_54);
    dStack_50 = dStack_50 * MS + dVar1;
  }
  return dStack_50 * (ARE + MRE) + -(MP * MRE);
}

Assistant:

static double ERREV(int NN, double *QR, double *QI, double MS, double MP, double ARE, double MRE) {
	/*
	C BOUNDS THE ERROR IN EVALUATING THE POLYNOMIAL BY THE HORNER
	C RECURRENCE.
	C QR,QI - THE PARTIAL SUMS
	C MS    -MODULUS OF THE POINT
	C MP    -MODULUS OF POLYNOMIAL VALUE
	C ARE, MRE -ERROR BOUNDS ON COMPLEX ADDITION AND MULTIPLICATION
	*/
	double errev, E;
	int i;

	E = CMOD(&QR[0], &QI[0]) * MRE / (ARE + MRE);

	for (i = 0; i < NN; ++i) {
		E = E*MS + CMOD(&QR[i], &QI[i]);
	}
	errev = E*(ARE + MRE) - MP*MRE;

	return errev;
}